

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnMemory
          (SharedValidator *this,Location *loc,Limits *limits,uint32_t page_size)

{
  pointer *ppMVar1;
  iterator __position;
  uint64_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  undefined5 uVar5;
  Result RVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  MemoryType local_48;
  
  bVar11 = false;
  if (((this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     (bVar11 = false, (this->options_).features.multi_memory_enabled_ == false)) {
    RVar6 = PrintError(this,loc,"only one memory block allowed");
    bVar11 = RVar6.enum_ == Error;
  }
  if (page_size != 0x10000) {
    if ((this->options_).features.custom_page_sizes_enabled_ == true) {
      if (page_size == 1) goto LAB_00195e31;
      pcVar8 = "only page sizes of 1 B or 64 KiB are allowed";
    }
    else {
      pcVar8 = "only default page size (64 KiB) is allowed";
    }
    RVar6 = PrintError(this,loc,pcVar8);
    bVar11 = (bool)(RVar6.enum_ == Error | bVar11);
  }
LAB_00195e31:
  if ((page_size ^ page_size - 1) <= page_size - 1) {
    abort();
  }
  uVar9 = -(ulong)limits->is_64 | 0xffffffff;
  uVar7 = uVar9 / page_size;
  RVar6 = CheckLimits(this,loc,limits,(page_size * uVar7 - uVar9 != 0) + uVar7,"pages");
  bVar10 = RVar6.enum_ == Error | bVar11;
  if (limits->is_shared == true) {
    if ((this->options_).features.threads_enabled_ == true) {
      if (limits->has_max != false) goto LAB_00195ec6;
      pcVar8 = "shared memories must have max sizes";
    }
    else {
      pcVar8 = "memories may not be shared";
    }
    RVar6 = PrintError(this,loc,pcVar8);
    bVar10 = bVar10 | RVar6.enum_ == Error;
  }
LAB_00195ec6:
  local_48.limits.has_max = limits->has_max;
  local_48.limits.is_shared = limits->is_shared;
  local_48.limits.is_64 = limits->is_64;
  local_48.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
  local_48.limits.initial = limits->initial;
  local_48.limits.max = limits->max;
  __position._M_current =
       (this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>::
    _M_realloc_insert<wabt::SharedValidator::MemoryType>(&this->memories_,__position,&local_48);
  }
  else {
    uVar2 = limits->initial;
    uVar3 = limits->max;
    bVar11 = limits->is_shared;
    bVar4 = limits->is_64;
    uVar5 = *(undefined5 *)&limits->field_0x13;
    ((__position._M_current)->limits).has_max = limits->has_max;
    ((__position._M_current)->limits).is_shared = bVar11;
    ((__position._M_current)->limits).is_64 = bVar4;
    *(undefined5 *)&((__position._M_current)->limits).field_0x13 = uVar5;
    ((__position._M_current)->limits).initial = uVar2;
    ((__position._M_current)->limits).max = uVar3;
    ppMVar1 = &(this->memories_).
               super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  RVar6.enum_._1_3_ = 0;
  RVar6.enum_._0_1_ = bVar10;
  return (Result)RVar6.enum_;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc,
                                 const Limits& limits,
                                 uint32_t page_size) {
  Result result = Result::Ok;
  if (memories_.size() > 0 && !options_.features.multi_memory_enabled()) {
    result |= PrintError(loc, "only one memory block allowed");
  }

  if (page_size != WABT_DEFAULT_PAGE_SIZE) {
    if (!options_.features.custom_page_sizes_enabled()) {
      result |= PrintError(loc, "only default page size (64 KiB) is allowed");
    } else if (page_size != 1) {
      result |= PrintError(loc, "only page sizes of 1 B or 64 KiB are allowed");
    }
  }

  uint64_t absolute_max = WABT_BYTES_TO_MIN_PAGES(
      (limits.is_64 ? UINT64_MAX : UINT32_MAX), page_size);
  result |= CheckLimits(loc, limits, absolute_max, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}